

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall UniValue::pushKVs(UniValue *this,UniValue *obj)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  const_reference val_;
  long lVar4;
  size_t i;
  ulong __n;
  
  bVar2 = obj->typ == VOBJ;
  bVar3 = this->typ == VOBJ;
  if (bVar2 && bVar3) {
    lVar4 = 0;
    for (__n = 0; pbVar1 = (obj->keys).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
        __n < (ulong)((long)(obj->keys).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        __n = __n + 1) {
      val_ = std::vector<UniValue,_std::allocator<UniValue>_>::at(&obj->values,__n);
      __pushKV(this,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4),val_);
      lVar4 = lVar4 + 0x20;
    }
  }
  return bVar2 && bVar3;
}

Assistant:

bool UniValue::pushKVs(const UniValue& obj)
{
    if (typ != VOBJ || obj.typ != VOBJ)
        return false;

    for (size_t i = 0; i < obj.keys.size(); i++)
        __pushKV(obj.keys[i], obj.values.at(i));

    return true;
}